

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::CountFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  AggregateFunction count_function;
  allocator local_3c1;
  string local_3c0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  CountFunctionBase::GetFunction();
  local_140.statistics = CountPropagateStats;
  ::std::__cxx11::string::string((string *)&local_3c0,"count",&local_3c1);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  AggregateFunction::AggregateFunction(&local_270,&local_140);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  CountStarFun::GetFunction();
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  AggregateFunction::~AggregateFunction(&local_140);
  return in_RDI;
}

Assistant:

AggregateFunctionSet CountFun::GetFunctions() {
	AggregateFunction count_function = CountFunctionBase::GetFunction();
	count_function.statistics = CountPropagateStats;
	AggregateFunctionSet count("count");
	count.AddFunction(count_function);
	// the count function can also be called without arguments
	count.AddFunction(CountStarFun::GetFunction());
	return count;
}